

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusBGNSPlanner.cpp
# Opt level: O1

void __thiscall
PerseusBGNSPlanner::PerseusBGNSPlanner
          (PerseusBGNSPlanner *this,PlanningUnitDecPOMDPDiscrete *pu,QAVParameters *params)

{
  undefined1 *this_00;
  undefined1 *this_01;
  
  this_01 = &(this->super_AlphaVectorBG).field_0xd0;
  AlphaVectorPlanning::AlphaVectorPlanning((AlphaVectorPlanning *)this_01,pu);
  AlphaVectorBG::AlphaVectorBG(&this->super_AlphaVectorBG,&PTR_construction_vtable_24__005ad060,pu);
  this_00 = &(this->super_AlphaVectorBG).field_0x18;
  PerseusNonStationaryQPlanner::PerseusNonStationaryQPlanner
            ((PerseusNonStationaryQPlanner *)this_00,&PTR_construction_vtable_24__005ad070,pu);
  (this->super_AlphaVectorBG)._vptr_AlphaVectorBG = (_func_int **)0x5acf70;
  *(undefined8 *)&(this->super_AlphaVectorBG).field_0xd0 = 0x5ad048;
  *(undefined8 *)&(this->super_AlphaVectorBG).field_0x18 = 0x5acfb0;
  *(BGBackupType *)&(this->super_AlphaVectorBG).field_0xc8 = params->bgBackupType;
  AlphaVectorPlanning::Initialize((AlphaVectorPlanning *)this_01);
  Perseus::Initialize((Perseus *)this_00);
  return;
}

Assistant:

PerseusBGNSPlanner::PerseusBGNSPlanner(const PlanningUnitDecPOMDPDiscrete* pu,
                                       const QAVParameters& params) :
    AlphaVectorPlanning(pu),
    AlphaVectorBG(pu),
    PerseusNonStationaryQPlanner(pu),
    _m_backupType(params.bgBackupType)
{
    AlphaVectorPlanning::Initialize();
    Perseus::Initialize();
}